

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::freeColSubstitution<HighsTripletPositionSlice,HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double rhs,double colCost,
          RowType rowType,HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  bool bVar1;
  reference this_00;
  vector<int,_std::allocator<int>_> *this_01;
  char *pcVar2;
  int in_EDX;
  int __c;
  int __c_00;
  int in_ESI;
  iterator *rhs_00;
  iterator *rhs_01;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  HighsSliceNonzero *colVal;
  iterator __end0_1;
  iterator __begin0_1;
  HighsMatrixSlice<HighsTripletListSlice> *__range2_1;
  HighsSliceNonzero *rowVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletPositionSlice> *__range2;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_fffffffffffffec0;
  FreeColSubstitution *in_stack_fffffffffffffec8;
  ReductionType type;
  HighsPostsolveStack *in_stack_fffffffffffffed0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  HighsDataStack *in_stack_fffffffffffffee0;
  iterator local_d8;
  iterator local_b8;
  undefined8 local_98;
  double local_90;
  reference local_88;
  iterator local_80;
  iterator local_60;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_10;
  int local_c;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x72679f);
  local_40 = local_30;
  HighsMatrixSlice<HighsTripletPositionSlice>::begin
            ((HighsMatrixSlice<HighsTripletPositionSlice> *)in_stack_fffffffffffffec0);
  HighsMatrixSlice<HighsTripletPositionSlice>::end
            ((HighsMatrixSlice<HighsTripletPositionSlice> *)in_stack_fffffffffffffec0);
  while( true ) {
    rhs_00 = &local_80;
    bVar1 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator!=(&local_60,rhs_00);
    if (!bVar1) break;
    local_88 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator*(&local_60);
    in_stack_fffffffffffffee0 = (HighsDataStack *)(in_RDI + 0xa8);
    in_stack_fffffffffffffed8 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x60);
    pcVar2 = HighsSliceNonzero::index(local_88,(char *)rhs_00,__c);
    std::vector<int,_std::allocator<int>_>::operator[](in_stack_fffffffffffffed8,(long)(int)pcVar2);
    local_90 = HighsSliceNonzero::value(local_88);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8,
               (double *)in_stack_fffffffffffffec0);
    HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator++(&local_60);
  }
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x72689b);
  local_98 = local_38;
  HighsMatrixSlice<HighsTripletListSlice>::begin(in_stack_fffffffffffffec0);
  HighsMatrixSlice<HighsTripletListSlice>::end(in_stack_fffffffffffffec0);
  while( true ) {
    rhs_01 = &local_d8;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_b8,rhs_01);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_b8);
    in_stack_fffffffffffffec8 = (FreeColSubstitution *)(in_RDI + 0xc0);
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x78);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs_01,__c_00);
    in_stack_fffffffffffffed0 =
         (HighsPostsolveStack *)
         std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8,(double *)this_01);
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_b8);
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_c);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_10);
  HighsDataStack::push<presolve::HighsPostsolveStack::FreeColSubstitution,_0>
            ((HighsDataStack *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  type = (ReductionType)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (in_stack_fffffffffffffee0,
             (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              *)in_stack_fffffffffffffed8);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (in_stack_fffffffffffffee0,
             (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              *)in_stack_fffffffffffffed8);
  reductionAdded(in_stack_fffffffffffffed0,type);
  return;
}

Assistant:

void freeColSubstitution(HighsInt row, HighsInt col, double rhs,
                           double colCost, RowType rowType,
                           const HighsMatrixSlice<RowStorageFormat>& rowVec,
                           const HighsMatrixSlice<ColStorageFormat>& colVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FreeColSubstitution{rhs, colCost, origRowIndex[row],
                                             origColIndex[col], rowType});
    reductionValues.push(rowValues);
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFreeColSubstitution);
  }